

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evp_enc.c
# Opt level: O0

void EVP_CIPHER_free(EVP_CIPHER *cipher)

{
  long in_RDI;
  int i;
  int local_c [3];
  
  if (((in_RDI != 0) && (*(int *)(in_RDI + 0x18) == 0)) &&
     (CRYPTO_DOWN_REF((int *)(in_RDI + 0x80),local_c,*(void **)(in_RDI + 0x88)), local_c[0] < 1)) {
    evp_cipher_free_int((EVP_CIPHER *)0x262503);
  }
  return;
}

Assistant:

void EVP_CIPHER_free(EVP_CIPHER *cipher)
{
    int i;

    if (cipher == NULL || cipher->origin != EVP_ORIG_DYNAMIC)
        return;

    CRYPTO_DOWN_REF(&cipher->refcnt, &i, cipher->lock);
    if (i > 0)
        return;
    evp_cipher_free_int(cipher);
}